

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

wchar_t check_symlinks_fsobj(char *path,wchar_t *a_eno,archive_string *a_estr,wchar_t flags)

{
  char cVar1;
  int fd;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  char *pcVar5;
  wchar_t *pwVar6;
  char *pcVar7;
  bool bVar8;
  stat_conflict st;
  stat local_c0;
  
  if (*path == '\0') {
    wVar3 = L'\0';
  }
  else {
    fd = open(".",0x80000);
    __archive_ensure_cloexec_flag(fd);
    if (-1 < fd) {
      pcVar4 = path + (*path == '/');
      pcVar7 = path;
LAB_004bfb57:
      pcVar5 = pcVar4 + -1;
      do {
        pcVar4 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
      } while (*pcVar4 == '/');
      for (; cVar1 = *pcVar5, cVar1 != '\0'; pcVar5 = pcVar5 + 1) {
        if (cVar1 == '/') {
          bVar8 = pcVar5[1] == '\0';
          goto LAB_004bfb86;
        }
      }
      bVar8 = true;
LAB_004bfb86:
      *pcVar5 = '\0';
      iVar2 = lstat(pcVar7,&local_c0);
      if (iVar2 == 0) {
        if ((local_c0.st_mode & 0xf000) != 0xa000) {
          if (((local_c0.st_mode & 0xf000) == 0x4000) && (!bVar8)) {
LAB_004bfbfe:
            iVar2 = chdir(pcVar7);
            if (iVar2 != 0) {
              *pcVar5 = cVar1;
              if (a_eno != (wchar_t *)0x0) {
                pwVar6 = __errno_location();
                *a_eno = *pwVar6;
              }
              wVar3 = L'\xffffffe2';
              if (a_estr != (archive_string *)0x0) {
                pcVar7 = "Could not chdir ";
                goto LAB_004bfd97;
              }
              goto LAB_004bfdad;
            }
            pcVar7 = pcVar5 + 1;
          }
LAB_004bfc27:
          *pcVar5 = cVar1;
          pcVar4 = pcVar5 + (cVar1 != '\0');
          if (bVar8) {
            pcVar5 = pcVar5 + (cVar1 != '\0');
LAB_004bfc71:
            wVar3 = L'\0';
LAB_004bfdad:
            *pcVar5 = cVar1;
            iVar2 = fchdir(fd);
            if (iVar2 != 0) {
              if (a_eno != (wchar_t *)0x0) {
                pwVar6 = __errno_location();
                *a_eno = *pwVar6;
              }
              wVar3 = L'\xffffffe2';
              if (a_estr != (archive_string *)0x0) {
                archive_string_sprintf(a_estr,"%s%s","chdir() failure","");
              }
            }
            close(fd);
            return wVar3;
          }
          goto LAB_004bfb57;
        }
        if (bVar8) {
          iVar2 = unlink(pcVar7);
          *pcVar5 = cVar1;
          if (iVar2 == 0) goto LAB_004bfc71;
          if (a_eno != (wchar_t *)0x0) {
            pwVar6 = __errno_location();
            *a_eno = *pwVar6;
          }
          wVar3 = L'\xffffffe7';
          if (a_estr == (archive_string *)0x0) goto LAB_004bfdad;
          pcVar7 = "Could not remove symlink ";
        }
        else {
          if ((flags & 0x10U) == 0) {
            if (((uint)flags >> 8 & 1) == 0) {
              iVar2 = stat(pcVar7,&local_c0);
              if (iVar2 != 0) {
                *pcVar5 = cVar1;
                pwVar6 = __errno_location();
                wVar3 = *pwVar6;
                if (wVar3 != L'\x02') goto LAB_004bfc8d;
                goto LAB_004bfc71;
              }
              if ((local_c0.st_mode & 0xf000) == 0x4000) goto LAB_004bfbfe;
            }
            *pcVar5 = cVar1;
            if (a_eno != (wchar_t *)0x0) {
              *a_eno = L'\0';
            }
            wVar3 = L'\xffffffe7';
            if (a_estr != (archive_string *)0x0) {
              pcVar7 = "Cannot extract through symlink ";
              goto LAB_004bfd97;
            }
            goto LAB_004bfdad;
          }
          iVar2 = unlink(pcVar7);
          *pcVar5 = cVar1;
          if (iVar2 == 0) goto LAB_004bfc27;
          if (a_eno != (wchar_t *)0x0) {
            *a_eno = L'\0';
          }
          wVar3 = L'\xffffffe7';
          if (a_estr == (archive_string *)0x0) goto LAB_004bfdad;
          pcVar7 = "Cannot remove intervening symlink ";
        }
      }
      else {
        *pcVar5 = cVar1;
        pwVar6 = __errno_location();
        wVar3 = *pwVar6;
        if (wVar3 == L'\x02') goto LAB_004bfc71;
LAB_004bfc8d:
        if (a_eno != (wchar_t *)0x0) {
          *a_eno = wVar3;
        }
        wVar3 = L'\xffffffe7';
        if (a_estr == (archive_string *)0x0) goto LAB_004bfdad;
        pcVar7 = "Could not stat ";
      }
LAB_004bfd97:
      archive_string_sprintf(a_estr,"%s%s",pcVar7,path);
      goto LAB_004bfdad;
    }
    wVar3 = L'\xffffffe2';
  }
  return wVar3;
}

Assistant:

static int
check_symlinks_fsobj(char *path, int *a_eno, struct archive_string *a_estr,
    int flags)
{
#if !defined(HAVE_LSTAT)
	/* Platform doesn't have lstat, so we can't look for symlinks. */
	(void)path; /* UNUSED */
	(void)error_number; /* UNUSED */
	(void)error_string; /* UNUSED */
	(void)flags; /* UNUSED */
	return (ARCHIVE_OK);
#else
	int res = ARCHIVE_OK;
	char *tail;
	char *head;
	int last;
	char c;
	int r;
	struct stat st;
	int restore_pwd;

	/* Nothing to do here if name is empty */
	if(path[0] == '\0')
	    return (ARCHIVE_OK);

	/*
	 * Guard against symlink tricks.  Reject any archive entry whose
	 * destination would be altered by a symlink.
	 *
	 * Walk the filename in chunks separated by '/'.  For each segment:
	 *  - if it doesn't exist, continue
	 *  - if it's symlink, abort or remove it
	 *  - if it's a directory and it's not the last chunk, cd into it
	 * As we go:
	 *  head points to the current (relative) path
	 *  tail points to the temporary \0 terminating the segment we're
	 *      currently examining
	 *  c holds what used to be in *tail
	 *  last is 1 if this is the last tail
	 */
	restore_pwd = open(".", O_RDONLY | O_BINARY | O_CLOEXEC);
	__archive_ensure_cloexec_flag(restore_pwd);
	if (restore_pwd < 0)
		return (ARCHIVE_FATAL);
	head = path;
	tail = path;
	last = 0;
	/* TODO: reintroduce a safe cache here? */
	/* Skip the root directory if the path is absolute. */
	if(tail == path && tail[0] == '/')
		++tail;
	/* Keep going until we've checked the entire name.
	 * head, tail, path all alias the same string, which is
	 * temporarily zeroed at tail, so be careful restoring the
	 * stashed (c=tail[0]) for error messages.
	 * Exiting the loop with break is okay; continue is not.
	 */
	while (!last) {
		/*
		 * Skip the separator we just consumed, plus any adjacent ones
		 */
		while (*tail == '/')
		    ++tail;
		/* Skip the next path element. */
		while (*tail != '\0' && *tail != '/')
			++tail;
		/* is this the last path component? */
		last = (tail[0] == '\0') || (tail[0] == '/' && tail[1] == '\0');
		/* temporarily truncate the string here */
		c = tail[0];
		tail[0] = '\0';
		/* Check that we haven't hit a symlink. */
		r = lstat(head, &st);
		if (r != 0) {
			tail[0] = c;
			/* We've hit a dir that doesn't exist; stop now. */
			if (errno == ENOENT) {
				break;
			} else {
				/*
				 * Treat any other error as fatal - best to be
				 * paranoid here.
				 * Note: This effectively disables deep
				 * directory support when security checks are
				 * enabled. Otherwise, very long pathnames that
				 * trigger an error here could evade the
				 * sandbox.
				 * TODO: We could do better, but it would
				 * probably require merging the symlink checks
				 * with the deep-directory editing.
				 */
				fsobj_error(a_eno, a_estr, errno,
				    "Could not stat ", path);
				res = ARCHIVE_FAILED;
				break;
			}
		} else if (S_ISDIR(st.st_mode)) {
			if (!last) {
				if (chdir(head) != 0) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, errno,
					    "Could not chdir ", path);
					res = (ARCHIVE_FATAL);
					break;
				}
				/* Our view is now from inside this dir: */
				head = tail + 1;
			}
		} else if (S_ISLNK(st.st_mode)) {
			if (last) {
				/*
				 * Last element is symlink; remove it
				 * so we can overwrite it with the
				 * item being extracted.
				 */
				if (unlink(head)) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, errno,
					    "Could not remove symlink ",
					    path);
					res = ARCHIVE_FAILED;
					break;
				}
				/*
				 * Even if we did remove it, a warning
				 * is in order.  The warning is silly,
				 * though, if we're just replacing one
				 * symlink with another symlink.
				 */
				tail[0] = c;
				/*
				 * FIXME:  not sure how important this is to
				 * restore
				 */
				/*
				if (!S_ISLNK(path)) {
					fsobj_error(a_eno, a_estr, 0,
					    "Removing symlink ", path);
				}
				*/
				/* Symlink gone.  No more problem! */
				res = ARCHIVE_OK;
				break;
			} else if (flags & ARCHIVE_EXTRACT_UNLINK) {
				/* User asked us to remove problems. */
				if (unlink(head) != 0) {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, 0,
					    "Cannot remove intervening "
					    "symlink ", path);
					res = ARCHIVE_FAILED;
					break;
				}
				tail[0] = c;
			} else if ((flags &
			    ARCHIVE_EXTRACT_SECURE_SYMLINKS) == 0) {
				/*
				 * We are not the last element and we want to
				 * follow symlinks if they are a directory.
				 * 
				 * This is needed to extract hardlinks over
				 * symlinks.
				 */
				r = stat(head, &st);
				if (r != 0) {
					tail[0] = c;
					if (errno == ENOENT) {
						break;
					} else {
						fsobj_error(a_eno, a_estr,
						    errno,
						    "Could not stat ", path);
						res = (ARCHIVE_FAILED);
						break;
					}
				} else if (S_ISDIR(st.st_mode)) {
					if (chdir(head) != 0) {
						tail[0] = c;
						fsobj_error(a_eno, a_estr,
						    errno,
						    "Could not chdir ", path);
						res = (ARCHIVE_FATAL);
						break;
					}
					/*
					 * Our view is now from inside
					 * this dir:
					 */
					head = tail + 1;
				} else {
					tail[0] = c;
					fsobj_error(a_eno, a_estr, 0,
					    "Cannot extract through "
					    "symlink ", path);
					res = ARCHIVE_FAILED;
					break;
				}
			} else {
				tail[0] = c;
				fsobj_error(a_eno, a_estr, 0,
				    "Cannot extract through symlink ", path);
				res = ARCHIVE_FAILED;
				break;
			}
		}
		/* be sure to always maintain this */
		tail[0] = c;
		if (tail[0] != '\0')
			tail++; /* Advance to the next segment. */
	}
	/* Catches loop exits via break */
	tail[0] = c;
#ifdef HAVE_FCHDIR
	/* If we changed directory above, restore it here. */
	if (restore_pwd >= 0) {
		r = fchdir(restore_pwd);
		if (r != 0) {
			fsobj_error(a_eno, a_estr, errno,
			    "chdir() failure", "");
		}
		close(restore_pwd);
		restore_pwd = -1;
		if (r != 0) {
			res = (ARCHIVE_FATAL);
		}
	}
#endif
	/* TODO: reintroduce a safe cache here? */
	return res;
#endif
}